

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

TidyOption tidyOptGetNextDocLinks(TidyDoc tdoc,TidyIterator *pos)

{
  TidyIterator local_38;
  TidyOption opt;
  TidyOptionId *curr;
  TidyIterator *pos_local;
  TidyDoc tdoc_local;
  
  local_38 = *pos;
  if (local_38->_opaque == 0) {
    *pos = (TidyIterator)0x0;
    tdoc_local = (TidyDoc)0x0;
  }
  else {
    tdoc_local = (TidyDoc)tidyGetOption(tdoc,local_38->_opaque);
    local_38 = local_38 + 1;
    if (local_38->_opaque == 0) {
      local_38 = (TidyIterator)0x0;
    }
    *pos = local_38;
  }
  return (TidyOption)tdoc_local;
}

Assistant:

TidyOption TIDY_CALL tidyOptGetNextDocLinks( TidyDoc tdoc, TidyIterator* pos )
{
    const TidyOptionId* curr = (const TidyOptionId *)*pos;
    TidyOption opt;

    if (*curr == TidyUnknownOption)
    {
        *pos = (TidyIterator)NULL;
        return (TidyOption)0;
    }
    opt = tidyGetOption(tdoc, *curr);
    curr++;
    *pos = (*curr == TidyUnknownOption ) ?
        (TidyIterator)NULL:(TidyIterator)curr;
    return opt;
}